

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O2

char * faidx_fetch_seq(faidx_t *fai,char *c_name,int p_beg_i,int p_end_i,int *len)

{
  kh_s_t *h;
  faidx1_t *pfVar1;
  long lVar2;
  khint_t kVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  ushort **ppuVar8;
  uint uVar9;
  ulong uVar10;
  
  h = fai->hash;
  kVar3 = kh_get_s(h,c_name);
  if (kVar3 == h->n_buckets) {
    *len = -2;
    pcVar7 = (char *)0x0;
    fprintf(_stderr,"[fai_fetch_seq] The sequence \"%s\" not found\n",c_name);
  }
  else {
    pfVar1 = h->vals;
    if (p_end_i < p_beg_i) {
      p_beg_i = p_end_i;
    }
    lVar2 = pfVar1[kVar3].len;
    uVar9 = 0;
    if ((-1 < p_beg_i) && (uVar9 = p_beg_i, lVar2 <= (long)(ulong)(uint)p_beg_i)) {
      uVar9 = (int)lVar2 - 1;
    }
    iVar4 = 0;
    if ((-1 < p_end_i) && (iVar4 = p_end_i, lVar2 <= (long)(ulong)(uint)p_end_i)) {
      iVar4 = (int)lVar2 + -1;
    }
    iVar5 = bgzf_useek(fai->bgzf,
                       pfVar1[kVar3].offset + (long)((int)uVar9 % pfVar1[kVar3].line_blen) +
                       (long)((int)uVar9 / pfVar1[kVar3].line_blen) * (long)pfVar1[kVar3].line_len,0
                      );
    if (iVar5 < 0) {
      *len = -1;
      fwrite("[fai_fetch_seq] Error: fai_fetch failed. (Seeking in a compressed, .gzi unindexed, file?)\n"
             ,0x5a,1,_stderr);
      pcVar7 = (char *)0x0;
    }
    else {
      pcVar7 = (char *)malloc((long)(int)((iVar4 - uVar9) + 2));
      uVar10 = 0;
      while( true ) {
        uVar6 = bgzf_getc(fai->bgzf);
        iVar5 = (int)uVar10;
        if (((int)uVar6 < 0) || ((int)(iVar4 - uVar9) < iVar5)) break;
        ppuVar8 = __ctype_b_loc();
        if ((short)(*ppuVar8)[uVar6] < 0) {
          pcVar7[uVar10] = (char)uVar6;
          uVar10 = (ulong)(iVar5 + 1);
        }
      }
      pcVar7[uVar10] = '\0';
      *len = iVar5;
    }
  }
  return pcVar7;
}

Assistant:

char *faidx_fetch_seq(const faidx_t *fai, const char *c_name, int p_beg_i, int p_end_i, int *len)
{
    int l, c;
    khiter_t iter;
    faidx1_t val;
    char *seq=NULL;

    // Adjust position
    iter = kh_get(s, fai->hash, c_name);
    if (iter == kh_end(fai->hash))
    {
        *len = -2;
        fprintf(stderr, "[fai_fetch_seq] The sequence \"%s\" not found\n", c_name);
        return NULL;
    }
    val = kh_value(fai->hash, iter);
    if(p_end_i < p_beg_i) p_beg_i = p_end_i;
    if(p_beg_i < 0) p_beg_i = 0;
    else if(val.len <= p_beg_i) p_beg_i = val.len - 1;
    if(p_end_i < 0) p_end_i = 0;
    else if(val.len <= p_end_i) p_end_i = val.len - 1;

    // Now retrieve the sequence
    int ret = bgzf_useek(fai->bgzf, val.offset + p_beg_i / val.line_blen * val.line_len + p_beg_i % val.line_blen, SEEK_SET);
    if ( ret<0 )
    {
        *len = -1;
        fprintf(stderr, "[fai_fetch_seq] Error: fai_fetch failed. (Seeking in a compressed, .gzi unindexed, file?)\n");
        return NULL;
    }
    l = 0;
    seq = (char*)malloc(p_end_i - p_beg_i + 2);
    while ( (c=bgzf_getc(fai->bgzf))>=0 && l < p_end_i - p_beg_i + 1)
        if (isgraph(c)) seq[l++] = c;
    seq[l] = '\0';
    *len = l;
    return seq;
}